

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_func(CPState *cp,CPDecl *fdecl)

{
  uint uVar1;
  CTypeID1 CVar2;
  int iVar3;
  CTypeID CVar4;
  CPDeclIdx CVar5;
  int local_a74;
  CType *pCStack_a70;
  int level;
  CType *ct;
  CTypeID fieldid;
  CTypeID ctypeid;
  CPDecl decl;
  CTypeID anchor;
  CTypeID lastid;
  CTInfo info;
  CTSize nargs;
  CPDecl *fdecl_local;
  CPState *cp_local;
  CType *local_80;
  CType *ct_1;
  
  lastid = 0;
  anchor = 0x60000000;
  decl.stack[99].name.gcptr64._4_4_ = 0;
  decl.stack[99].name.gcptr64._0_4_ = 0;
  if (cp->tok != 0x29) {
    do {
      iVar3 = cp_opt(cp,0x2e);
      if (iVar3 != 0) {
        cp_check(cp,0x2e);
        cp_check(cp,0x2e);
        anchor = 0x60800000;
        break;
      }
      cp_decl_spec(cp,(CPDecl *)&fieldid,0x80000);
      decl.pos = 6;
      cp_declarator(cp,(CPDecl *)&fieldid);
      ct._4_4_ = cp_decl_intern(cp,(CPDecl *)&fieldid);
      for (local_80 = cp->cts->tab + ct._4_4_; local_80->info >> 0x1c == 8;
          local_80 = cp->cts->tab + (local_80->info & 0xffff)) {
      }
      pCStack_a70 = local_80;
      if (local_80->info >> 0x1c == 4) break;
      if ((local_80->info & 0xfc000000) == 0x30000000) {
        ct._4_4_ = lj_ctype_intern(cp->cts,(local_80->info & 0xffff | 0x30000) + 0x20000000,8);
      }
      else if (local_80->info >> 0x1c == 6) {
        ct._4_4_ = lj_ctype_intern(cp->cts,(ct._4_4_ | 0x30000) + 0x20000000,8);
      }
      ct._0_4_ = lj_ctype_new(cp->cts,&stack0xfffffffffffff590);
      CVar4 = (CTypeID)ct;
      if ((CTypeID)decl.stack[99].name.gcptr64 != 0) {
        cp->cts->tab[decl.stack[99].name.gcptr64._4_4_].sib = (CTypeID1)(CTypeID)ct;
        CVar4 = (CTypeID)decl.stack[99].name.gcptr64;
      }
      decl.stack[99].name.gcptr64._0_4_ = CVar4;
      if (decl.cp != (CPState *)0x0) {
        *(byte *)&((decl.cp)->val).field_0 = *(byte *)&((decl.cp)->val).field_0 | 0x20;
        (pCStack_a70->name).gcptr64 = (uint64_t)decl.cp;
      }
      pCStack_a70->info = ct._4_4_ + 0x90000000;
      CVar4 = lastid + 1;
      pCStack_a70->size = lastid;
      decl.stack[99].name.gcptr64._4_4_ = (CTypeID)ct;
      iVar3 = cp_opt(cp,0x2c);
      lastid = CVar4;
    } while (iVar3 != 0);
  }
  cp_check(cp,0x29);
  iVar3 = cp_opt(cp,0x7b);
  if (iVar3 == 0) {
LAB_0018f21b:
    uVar1 = fdecl->fattr;
    fdecl->fattr = 0;
    CVar2 = (CTypeID1)(CTypeID)decl.stack[99].name.gcptr64;
    CVar5 = cp_add(fdecl,uVar1 & 0xffff0000 | anchor,lastid);
    fdecl->stack[CVar5].sib = CVar2;
    return;
  }
  local_a74 = 1;
  cp->mode = cp->mode | 0x20;
  do {
    if (cp->tok == 0x7b) {
      local_a74 = local_a74 + 1;
    }
    else {
      if ((cp->tok == 0x7d) && (local_a74 = local_a74 + -1, local_a74 == 0)) {
        cp->mode = cp->mode & 0xffffffdf;
        cp->tok = 0x3b;
        goto LAB_0018f21b;
      }
      if (cp->tok == 0x103) {
        cp_err_token(cp,0x7d);
      }
    }
    cp_next(cp);
  } while( true );
}

Assistant:

static void cp_decl_func(CPState *cp, CPDecl *fdecl)
{
  CTSize nargs = 0;
  CTInfo info = CTINFO(CT_FUNC, 0);
  CTypeID lastid = 0, anchor = 0;
  if (cp->tok != ')') {
    do {
      CPDecl decl;
      CTypeID ctypeid, fieldid;
      CType *ct;
      if (cp_opt(cp, '.')) {  /* Vararg function. */
	cp_check(cp, '.');  /* Workaround for the minimalistic lexer. */
	cp_check(cp, '.');
	info |= CTF_VARARG;
	break;
      }
      cp_decl_spec(cp, &decl, CDF_REGISTER);
      decl.mode = CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT;
      cp_declarator(cp, &decl);
      ctypeid = cp_decl_intern(cp, &decl);
      ct = ctype_raw(cp->cts, ctypeid);
      if (ctype_isvoid(ct->info))
	break;
      else if (ctype_isrefarray(ct->info))
	ctypeid = lj_ctype_intern(cp->cts,
	  CTINFO(CT_PTR, CTALIGN_PTR|ctype_cid(ct->info)), CTSIZE_PTR);
      else if (ctype_isfunc(ct->info))
	ctypeid = lj_ctype_intern(cp->cts,
	  CTINFO(CT_PTR, CTALIGN_PTR|ctypeid), CTSIZE_PTR);
      /* Add new parameter. */
      fieldid = lj_ctype_new(cp->cts, &ct);
      if (anchor)
	ctype_get(cp->cts, lastid)->sib = fieldid;
      else
	anchor = fieldid;
      lastid = fieldid;
      if (decl.name) ctype_setname(ct, decl.name);
      ct->info = CTINFO(CT_FIELD, ctypeid);
      ct->size = nargs++;
    } while (cp_opt(cp, ','));
  }
  cp_check(cp, ')');
  if (cp_opt(cp, '{')) {  /* Skip function definition. */
    int level = 1;
    cp->mode |= CPARSE_MODE_SKIP;
    for (;;) {
      if (cp->tok == '{') level++;
      else if (cp->tok == '}' && --level == 0) break;
      else if (cp->tok == CTOK_EOF) cp_err_token(cp, '}');
      cp_next(cp);
    }
    cp->mode &= ~CPARSE_MODE_SKIP;
    cp->tok = ';';  /* Ok for cp_decl_multi(), error in cp_decl_single(). */
  }
  info |= (fdecl->fattr & ~CTMASK_CID);
  fdecl->fattr = 0;
  fdecl->stack[cp_add(fdecl, info, nargs)].sib = anchor;
}